

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O3

BuiltinFuncGroup * __thiscall
vkt::sr::anon_unknown_0::BuiltinFuncGroup::operator<<(BuiltinFuncGroup *this,BuiltinFuncInfo *info)

{
  pointer *ppBVar1;
  pointer pBVar2;
  pointer pBVar3;
  pointer pBVar4;
  ulong uVar5;
  pointer pBVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  pointer pBVar10;
  pointer pBVar11;
  undefined8 *puVar12;
  pointer pBVar13;
  _Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
  *this_00;
  byte bVar14;
  
  bVar14 = 0;
  pBVar11 = (this->funcInfos).
            super__Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pBVar11 ==
      (this->funcInfos).
      super__Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pBVar2 = (this->funcInfos).
             super__Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar7 = (long)pBVar11 - (long)pBVar2;
    if (lVar7 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar8 = (lVar7 >> 3) * -0x1111111111111111;
    uVar5 = 1;
    if (pBVar11 != pBVar2) {
      uVar5 = uVar8;
    }
    this_00 = (_Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
               *)(uVar5 + uVar8);
    if ((_Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
         *)0x111111111111110 < this_00) {
      this_00 = (_Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
                 *)0x111111111111111;
    }
    if (CARRY8(uVar5,uVar8)) {
      this_00 = (_Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
                 *)0x111111111111111;
    }
    pBVar6 = std::
             _Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
             ::_M_allocate(this_00,(size_t)info);
    puVar12 = (undefined8 *)(lVar7 + (long)pBVar6);
    for (lVar9 = 0xf; pBVar3 = pBVar2, pBVar4 = pBVar6, lVar9 != 0; lVar9 = lVar9 + -1) {
      *puVar12 = info->caseName;
      info = (BuiltinFuncInfo *)((long)info + (ulong)bVar14 * -0x10 + 8);
      puVar12 = puVar12 + (ulong)bVar14 * -2 + 1;
    }
    for (; pBVar11 != pBVar3; pBVar3 = pBVar3 + 1) {
      pBVar10 = pBVar3;
      pBVar13 = pBVar4;
      for (lVar7 = 0xf; lVar7 != 0; lVar7 = lVar7 + -1) {
        pBVar13->caseName = pBVar10->caseName;
        pBVar10 = (pointer)((long)pBVar10 + (ulong)bVar14 * -0x10 + 8);
        pBVar13 = (pointer)((long)pBVar13 + (ulong)bVar14 * -0x10 + 8);
      }
      pBVar4 = pBVar4 + 1;
    }
    if (pBVar2 != (pointer)0x0) {
      operator_delete(pBVar2,(long)(this->funcInfos).
                                   super__Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pBVar2
                     );
    }
    (this->funcInfos).
    super__Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = pBVar6;
    (this->funcInfos).
    super__Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = pBVar4 + 1;
    (this->funcInfos).
    super__Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pBVar6 + (long)this_00;
  }
  else {
    for (lVar7 = 0xf; lVar7 != 0; lVar7 = lVar7 + -1) {
      pBVar11->caseName = info->caseName;
      info = (BuiltinFuncInfo *)&info->shaderFuncName;
      pBVar11 = (pointer)&pBVar11->shaderFuncName;
    }
    ppBVar1 = &(this->funcInfos).
               super__Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppBVar1 = *ppBVar1 + 1;
  }
  return this;
}

Assistant:

BuiltinFuncGroup&	operator<<			(const BuiltinFuncInfo& info) { funcInfos.push_back(info); return *this; }